

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLayerComparer::ImageLayerComparer
          (ImageLayerComparer *this,LayeredImage *reference,IVec2 *relevantRegion)

{
  (this->super_ImageLayerVerifier)._vptr_ImageLayerVerifier = (_func_int **)&PTR_operator___01e531f0
  ;
  this->m_reference = reference;
  if ((0 < relevantRegion->m_data[0]) && (0 < relevantRegion->m_data[1])) {
    tcu::Vector<int,_2>::Vector(&this->m_relevantRegion,relevantRegion);
    return;
  }
  *(undefined8 *)(this->m_relevantRegion).m_data = *(undefined8 *)(reference->m_size).m_data;
  return;
}

Assistant:

ImageLayerComparer (const LayeredImage& reference,
						const IVec2& relevantRegion = IVec2(0) /* If given, only check this region of each slice. */)
		: m_reference		(reference)
		, m_relevantRegion	(relevantRegion.x() > 0 && relevantRegion.y() > 0 ? relevantRegion : reference.getSize().swizzle(0, 1))
	{
	}